

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int lookup_path_in_map(char *path_elem,MMDB_s *mmdb,MMDB_entry_data_s *entry_data)

{
  int iVar1;
  size_t __n;
  int status_2;
  int status_3;
  int status_1;
  uint32_t offset_to_value;
  int status;
  MMDB_entry_data_s value;
  MMDB_entry_data_s key;
  size_t path_elem_len;
  uint32_t offset;
  uint32_t size;
  MMDB_entry_data_s *entry_data_local;
  MMDB_s *mmdb_local;
  char *path_elem_local;
  
  path_elem_len._4_4_ = entry_data->data_size;
  path_elem_len._0_4_ = entry_data->offset_to_next;
  __n = strlen(path_elem);
  while( true ) {
    if (path_elem_len._4_4_ == 0) {
      memset(entry_data,0,0x30);
      return 9;
    }
    iVar1 = decode_one_follow(mmdb,(uint32_t)path_elem_len,(MMDB_entry_data_s *)&value.data_size);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (key.offset_to_next != 2) {
      return 7;
    }
    if ((key.offset == __n) && (iVar1 = memcmp(path_elem,(void *)key._8_8_,__n), iVar1 == 0)) break;
    iVar1 = decode_one(mmdb,key.field_1.uint128._12_4_,(MMDB_entry_data_s *)&offset_to_value);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = skip_map_or_array(mmdb,(MMDB_entry_data_s *)&offset_to_value);
    if (iVar1 != 0) {
      return iVar1;
    }
    path_elem_len._0_4_ = value.field_1.uint128._12_4_;
    path_elem_len._4_4_ = path_elem_len._4_4_ - 1;
  }
  iVar1 = decode_one_follow(mmdb,key.field_1.uint128._12_4_,(MMDB_entry_data_s *)&offset_to_value);
  if (iVar1 != 0) {
    return iVar1;
  }
  memcpy(entry_data,&offset_to_value,0x30);
  return 0;
}

Assistant:

static int lookup_path_in_map(const char *path_elem,
                              const MMDB_s *const mmdb,
                              MMDB_entry_data_s *entry_data) {
    uint32_t size = entry_data->data_size;
    uint32_t offset = entry_data->offset_to_next;
    size_t path_elem_len = strlen(path_elem);

    while (size-- > 0) {
        MMDB_entry_data_s key, value;
        CHECKED_DECODE_ONE_FOLLOW(mmdb, offset, &key);

        uint32_t offset_to_value = key.offset_to_next;

        if (MMDB_DATA_TYPE_UTF8_STRING != key.type) {
            return MMDB_INVALID_DATA_ERROR;
        }

        if (key.data_size == path_elem_len &&
            !memcmp(path_elem, key.utf8_string, path_elem_len)) {

            DEBUG_MSG("found key matching path elem");

            CHECKED_DECODE_ONE_FOLLOW(mmdb, offset_to_value, &value);
            memcpy(entry_data, &value, sizeof(MMDB_entry_data_s));
            return MMDB_SUCCESS;
        } else {
            /* We don't want to follow a pointer here. If the next element is
             * a pointer we simply skip it and keep going */
            CHECKED_DECODE_ONE(mmdb, offset_to_value, &value);
            int status = skip_map_or_array(mmdb, &value);
            if (MMDB_SUCCESS != status) {
                return status;
            }
            offset = value.offset_to_next;
        }
    }

    memset(entry_data, 0, sizeof(MMDB_entry_data_s));
    return MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR;
}